

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_append_entries_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  element_type *peVar2;
  ulong uVar3;
  ulong uVar4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  ulong uVar9;
  undefined4 extraout_var;
  ulong uVar10;
  undefined4 extraout_var_00;
  uint64_t uVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar12;
  uint uVar13;
  char *pcVar14;
  mutex *pmVar15;
  int64 iVar16;
  bool bVar17;
  ptr<req_msg> req;
  ptr<peer> p;
  uint64_t new_matched_idx;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  int64 local_90;
  int local_88;
  int32 local_84;
  ptr<log_entry> custom_noti_le;
  undefined1 local_70 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                (resp->super_msg_base).src_);
  iVar8 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->peers_)._M_h,(key_type_conflict *)&req);
  if (iVar8.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      return;
    }
    iVar7 = (*peVar2->_vptr_logger[7])();
    if (iVar7 < 4) {
      return;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)&req,"the response is from an unknown peer %d",
               (ulong)(uint)(resp->super_msg_base).src_);
    (*peVar2->_vptr_logger[8])
              (peVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"handle_append_entries_resp",0x3bd,&req);
    std::__cxx11::string::~string((string *)&req);
    return;
  }
  check_srv_to_leave_timeout(this);
  peVar1 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((((peVar1 != (element_type *)0x0) &&
       (((peVar1->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->id_ == (resp->super_msg_base).src_)) &&
      (((peVar1->stepping_down_)._M_base._M_i & 1U) != 0)) &&
     (this->srv_to_leave_target_idx_ < resp->next_idx_)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&req,"server to be removed %d fully caught up the target config log %lu",
                 (ulong)(uint)((((this->srv_to_leave_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                )->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,this->srv_to_leave_target_idx_);
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3ca,&req);
      std::__cxx11::string::~string((string *)&req);
    }
    remove_peer_from_peers(this,&this->srv_to_leave_);
    reset_srv_to_leave(this);
    return;
  }
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)iVar8.
                    super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                    ._M_cur + 0x10));
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    iVar16 = resp->next_batch_size_hint_in_bytes_;
  }
  else {
    iVar7 = (*peVar2->_vptr_logger[7])();
    if (5 < iVar7) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&req,"handle append entries resp (from %d), resp.get_next_idx(): %lu",
                 (ulong)(uint)(((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,resp->next_idx_);
      (*peVar2->_vptr_logger[8])
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3d6,&req);
      std::__cxx11::string::~string((string *)&req);
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar16 = resp->next_batch_size_hint_in_bytes_;
    if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 5 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&req,"peer %d batch size hint: %ld bytes",
                 (ulong)(uint)(((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar2->_vptr_logger[8])
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3d9,&req);
      std::__cxx11::string::~string((string *)&req);
    }
  }
  LOCK();
  ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  next_batch_size_hint_in_bytes_).super___atomic_base<long>._M_i = iVar16;
  UNLOCK();
  if (resp->accepted_ == true) {
    new_matched_idx = 0;
    pmVar15 = &(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lock_;
    std::mutex::lock(pmVar15);
    uVar9 = resp->next_idx_;
    LOCK();
    ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_).
    super___atomic_base<unsigned_long>._M_i = uVar9;
    UNLOCK();
    uVar3 = (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->matched_idx_;
    new_matched_idx = uVar9 - 1;
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 5 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&req,"peer %d, prev matched idx: %lu, new matched idx: %lu",
                 (ulong)(uint)(((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,uVar3);
      (*peVar2->_vptr_logger[8])
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3e5,&req);
      std::__cxx11::string::~string((string *)&req);
    }
    (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->matched_idx_ =
         new_matched_idx;
    LOCK();
    ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->last_accepted_log_idx_
    ).super___atomic_base<unsigned_long>._M_i = new_matched_idx;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)pmVar15);
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44((this->leader_).super___atomic_base<int>._M_i,this->id_);
    req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         (((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
    cb_func::call(&((this->ctx_)._M_t.
                    super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                    .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                  GotAppendEntryRespFromPeer,(Param *)&req);
    uVar9 = get_expected_committed_log_idx(this);
    commit(this,uVar9);
    bVar6 = peer::clear_pending_commit
                      (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar17 = true;
    if (!bVar6) {
      uVar10 = resp->next_idx_;
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      bVar17 = uVar10 < CONCAT44(extraout_var,iVar7);
    }
  }
  else {
    pmVar15 = &(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lock_;
    std::mutex::lock(pmVar15);
    uVar4 = ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_)
            .super___atomic_base<unsigned_long>._M_i;
    uVar10 = resp->next_idx_;
    if (uVar10 < uVar4 && uVar10 != 0) {
LAB_00129f96:
      LOCK();
      ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_).
      super___atomic_base<unsigned_long>._M_i = uVar10;
      UNLOCK();
    }
    else {
      local_90 = iVar16;
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&req,
                 &(resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
      peVar5 = req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (peVar5 == (element_type *)0x0) {
        bVar17 = true;
      }
      else {
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&req,
                   &(resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
        resp_appendix::deserialize
                  ((resp_appendix *)&new_matched_idx,
                   (buffer *)
                   req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        bVar17 = *(char *)new_matched_idx != '\x01';
        if ((handle_append_entries_resp(nuraft::resp_msg&)::extra_order_timer == '\0') &&
           (iVar7 = __cxa_guard_acquire(&handle_append_entries_resp(nuraft::resp_msg&)::
                                         extra_order_timer), iVar7 != 0)) {
          timer_helper::timer_helper(&handle_append_entries_resp::extra_order_timer,1000000,true);
          __cxa_guard_release(&handle_append_entries_resp(nuraft::resp_msg&)::extra_order_timer);
        }
        bVar6 = timer_helper::timeout_and_reset(&handle_append_entries_resp::extra_order_timer);
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar7 = (*peVar2->_vptr_logger[7])();
          uVar13 = (uint)!bVar6 * 2 + 4;
          if ((int)uVar13 <= iVar7) {
            local_58 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
            pcVar14 = "UNKNOWN";
            if (*(char *)new_matched_idx == '\x01') {
              pcVar14 = "DO_NOT_REWIND";
            }
            pcVar12 = "NONE";
            if (*(char *)new_matched_idx != '\0') {
              pcVar12 = pcVar14;
            }
            msg_if_given_abi_cxx11_((string *)&req,"received extra order: %s",pcVar12);
            (*local_58->_vptr_logger[8])
                      (local_58,(ulong)uVar13,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"handle_append_entries_resp",0x407,&req);
            std::__cxx11::string::~string((string *)&req);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
      }
      iVar16 = local_90;
      if ((uVar4 != 0) && (bVar17)) {
        uVar10 = uVar4 - 1;
        goto LAB_00129f96;
      }
    }
    bVar17 = peer::need_to_suppress_error
                       (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((handle_append_entries_resp(nuraft::resp_msg&)::log_timer == '\0') &&
       (iVar7 = __cxa_guard_acquire(&handle_append_entries_resp(nuraft::resp_msg&)::log_timer),
       iVar7 != 0)) {
      timer_helper::timer_helper(&handle_append_entries_resp::log_timer,500000,true);
      __cxa_guard_release(&handle_append_entries_resp(nuraft::resp_msg&)::log_timer);
    }
    if (bVar17) {
      uVar13 = 4;
    }
    else {
      bVar17 = timer_helper::timeout_and_reset(&handle_append_entries_resp::log_timer);
      uVar13 = (uint)!bVar17 + (uint)!bVar17 * 2 + 3;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar7 = (*peVar2->_vptr_logger[7])(), (int)uVar13 <= iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_90 = iVar16;
      msg_if_given_abi_cxx11_
                ((string *)&req,
                 "declined append: peer %d, prev next log idx %lu, resp next %lu, new next log idx %lu"
                 ,(ulong)(uint)(((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id_,uVar4,resp->next_idx_,
                 ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 next_log_idx_).super___atomic_base<unsigned_long>._M_i);
      (*peVar2->_vptr_logger[8])
                (peVar2,(ulong)uVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x41d,&req);
      std::__cxx11::string::~string((string *)&req);
      iVar16 = local_90;
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar15);
    bVar17 = true;
  }
  uVar9 = (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->matched_idx_;
  if (((this->write_paused_)._M_base._M_i & 1U) != 0) {
    if ((((uVar9 != 0) &&
         ((((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_ ==
          (this->next_leader_candidate_).super___atomic_base<int>._M_i)) &&
        (iVar7 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[2])(), uVar9 == CONCAT44(extraout_var_00,iVar7) - 1U)) &&
       (bVar6 = peer::make_busy(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr), bVar6)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar13 = (this->next_leader_candidate_).super___atomic_base<int>._M_i;
        uVar11 = timer_helper::get_us(&this->reelection_timer_);
        msg_if_given_abi_cxx11_
                  ((string *)&req,
                   "ready to resign, server id %d, latest log index %lu, %lu us elapsed, resign now"
                   ,(ulong)uVar13,uVar9,uVar11);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"handle_append_entries_resp",0x433,&req);
        std::__cxx11::string::~string((string *)&req);
      }
      LOCK();
      (this->leader_).super___atomic_base<int>._M_i = -1;
      UNLOCK();
      a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)&(this->rand_timeout_).super__Function_base._M_functor;
      req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(this->rand_timeout_).super__Function_base._M_functor + 8);
      *(raft_server **)&(this->rand_timeout_).super__Function_base._M_functor = this;
      *(undefined8 *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 8) = 0;
      (this->rand_timeout_).super__Function_base._M_manager =
           std::
           _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx:1080:25)>
           ::_M_manager;
      (this->rand_timeout_)._M_invoker =
           std::
           _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx:1080:25)>
           ::_M_invoke;
      new_matched_idx = (uint64_t)this;
      std::_Function_base::~_Function_base((_Function_base *)&req);
      become_follower(this);
      update_rand_timeout(this);
      LOCK();
      (this->hb_alive_)._M_base._M_i = false;
      UNLOCK();
      new_matched_idx =
           (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->term_).super___atomic_base<unsigned_long>._M_i;
      local_88 = 0x1c;
      local_84 = (((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_)
                  .super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)term_for_log(this,CONCAT44(extraout_var_01,iVar7) - 1);
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      local_70._8_8_ = CONCAT44(extraout_var_02,iVar7) + -1;
      local_70._0_8_ = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
      std::
      make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
                ((unsigned_long *)&req,(msg_type *)&new_matched_idx,&local_88,&this->id_,
                 (unsigned_long *)&local_84,(unsigned_long *)&custom_noti_le,
                 (unsigned_long *)(local_70 + 8));
      custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._4_4_,2);
      std::make_shared<nuraft::custom_notification_msg,nuraft::custom_notification_msg::type>
                ((type *)&new_matched_idx);
      local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
      custom_notification_msg::serialize((custom_notification_msg *)(local_70 + 8));
      local_88 = CONCAT31(local_88._1_3_,0xe7);
      std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                ((int *)&custom_noti_le,(shared_ptr<nuraft::buffer> *)local_70,local_70 + 8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   log_entries_,&custom_noti_le);
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      peer::send_req(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ptr<peer> *)&local_40,&req,&this->resp_handler_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      goto LAB_0012a3be;
    }
  }
  if ((this->role_)._M_i == leader) {
    if ((bool)(-1 < iVar16 & bVar17)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 4 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&req,"reqeust append entries need to catchup, p %d\n",
                   (ulong)(uint)(((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar2->_vptr_logger[8])
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"handle_append_entries_resp",0x467,&req);
        std::__cxx11::string::~string((string *)&req);
      }
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      request_append_entries(this,(ptr<peer> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
    bVar17 = timer_helper::timeout_and_reset(&this->status_check_timer_);
    if (bVar17) {
      check_overall_status(this);
    }
  }
LAB_0012a3be:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void raft_server::handle_append_entries_resp(resp_msg& resp) {
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }

    check_srv_to_leave_timeout();
    if ( srv_to_leave_ &&
         srv_to_leave_->get_id() == resp.get_src() &&
         srv_to_leave_->is_stepping_down() &&
         resp.get_next_idx() > srv_to_leave_target_idx_ ) {
        // Catch-up is done.
        p_in("server to be removed %d fully caught up the "
             "target config log %" PRIu64,
             srv_to_leave_->get_id(),
             srv_to_leave_target_idx_);
        remove_peer_from_peers(srv_to_leave_);
        reset_srv_to_leave();
        return;
    }

    // If there are pending logs to be synced or commit index need to be advanced,
    // continue to send appendEntries to this peer
    bool need_to_catchup = true;

    ptr<peer> p = it->second;
    p_tr("handle append entries resp (from %d), resp.get_next_idx(): %" PRIu64,
         (int)p->get_id(), resp.get_next_idx());

    int64 bs_hint = resp.get_next_batch_size_hint_in_bytes();
    p_tr("peer %d batch size hint: %" PRId64 " bytes", p->get_id(), bs_hint);
    p->set_next_batch_size_hint_in_bytes(bs_hint);

    if (resp.get_accepted()) {
        uint64_t prev_matched_idx = 0;
        uint64_t new_matched_idx = 0;
        {
            std::lock_guard<std::mutex> l(p->get_lock());
            p->set_next_log_idx(resp.get_next_idx());
            prev_matched_idx = p->get_matched_idx();
            new_matched_idx = resp.get_next_idx() - 1;
            p_tr("peer %d, prev matched idx: %" PRIu64 ", new matched idx: %" PRIu64,
                 p->get_id(), prev_matched_idx, new_matched_idx);
            p->set_matched_idx(new_matched_idx);
            p->set_last_accepted_log_idx(new_matched_idx);
        }
        cb_func::Param param(id_, leader_, p->get_id());
        param.ctx = &new_matched_idx;
        CbReturnCode rc = ctx_->cb_func_.call
                          ( cb_func::GotAppendEntryRespFromPeer, &param );
        (void)rc;

        // Try to commit with this response.
        ulong committed_index = get_expected_committed_log_idx();
        commit( committed_index );
        need_to_catchup = p->clear_pending_commit() ||
                          resp.get_next_idx() < log_store_->next_slot();

    } else {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ulong prev_next_log = p->get_next_log_idx();
        if (resp.get_next_idx() > 0 && prev_next_log > resp.get_next_idx()) {
            // fast move for the peer to catch up
            p->set_next_log_idx(resp.get_next_idx());
        } else {
            bool do_log_rewind = true;
            // If not, check an extra order exists.
            if (resp.get_ctx()) {
                ptr<resp_appendix> appendix = resp_appendix::deserialize(*resp.get_ctx());
                if (appendix->extra_order_ == resp_appendix::DO_NOT_REWIND) {
                    do_log_rewind = false;
                }

                static timer_helper extra_order_timer(1000 * 1000, true);
                int log_lv = extra_order_timer.timeout_and_reset() ? L_INFO : L_TRACE;
                p_lv(log_lv, "received extra order: %s",
                     resp_appendix::extra_order_msg(appendix->extra_order_));
            }
            // if not, move one log backward.
            // WARNING: Make sure that `next_log_idx_` shouldn't be smaller than 0.
            if (do_log_rewind && prev_next_log) {
                p->set_next_log_idx(prev_next_log - 1);
            }
        }
        bool suppress = p->need_to_suppress_error();

        // To avoid verbose logs here.
        static timer_helper log_timer(500 * 1000, true);
        int log_lv = suppress ? L_INFO : L_WARN;
        if (log_lv == L_WARN) {
            if (!log_timer.timeout_and_reset()) {
                log_lv = L_TRACE;
            }
        }
        p_lv( log_lv,
              "declined append: peer %d, prev next log idx %" PRIu64 ", "
              "resp next %" PRIu64 ", new next log idx %" PRIu64,
              p->get_id(), prev_next_log,
              resp.get_next_idx(), p->get_next_log_idx() );
    }

    // NOTE:
    //   If all other followers are not responding, we may not make
    //   below condition true. In that case, we check the timeout of
    //   re-election timer in heartbeat handler, and do force resign.
    ulong p_matched_idx = p->get_matched_idx();
    if ( write_paused_ &&
         p->get_id() == next_leader_candidate_ &&
         p_matched_idx &&
         p_matched_idx == log_store_->next_slot() - 1 &&
         p->make_busy() ) {
        // NOTE:
        //   If `make_busy` fails (very unlikely to happen), next
        //   response handler (of heartbeat, append_entries ..) will
        //   retry this.
        p_in("ready to resign, server id %d, "
             "latest log index %" PRIu64 ", "
             "%" PRIu64 " us elapsed, resign now",
             next_leader_candidate_.load(),
             p_matched_idx,
             reelection_timer_.get_us());
        leader_ = -1;

        // To avoid this node becomes next leader again, set timeout
        // value bigger than any others, just once at this time.
        rand_timeout_ = [this]() -> int32 {
            return this->ctx_->get_params()->election_timeout_upper_bound_ +
                   this->ctx_->get_params()->election_timeout_lower_bound_;
        };
        become_follower();
        update_rand_timeout();

        // Clear live flag to avoid pre-vote rejection.
        hb_alive_ = false;

        // Send leadership takeover request to this follower.
        ptr<req_msg> req = cs_new<req_msg>
                           ( state_->get_term(),
                             msg_type::custom_notification_request,
                             id_, p->get_id(),
                             term_for_log(log_store_->next_slot() - 1),
                             log_store_->next_slot() - 1,
                             quick_commit_index_.load() );

        // Create a notification.
        ptr<custom_notification_msg> custom_noti =
            cs_new<custom_notification_msg>
            ( custom_notification_msg::leadership_takeover );

        // Wrap it using log_entry.
        ptr<log_entry> custom_noti_le =
            cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

        req->log_entries().push_back(custom_noti_le);
        p->send_req(p, req, resp_handler_);
        return;
    }

    if (bs_hint < 0) {
        // If hint is a negative number, we should set `need_to_catchup`
        // to `false` to avoid sending meaningless messages continuously
        // which eats up CPU. Then the leader will send heartbeats only.
        need_to_catchup = false;
    }

    // This may not be a leader anymore,
    // such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader) {
        if (need_to_catchup) {
            p_db("reqeust append entries need to catchup, p %d\n",
                 (int)p->get_id());
            request_append_entries(p);
        }
        if (status_check_timer_.timeout_and_reset()) {
            check_overall_status();
        }
    }
}